

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

SerialArenaChunk *
google::protobuf::internal::ThreadSafeArena::NewSerialArenaChunk
          (uint32_t prev_capacity,void *id,SerialArena *serial)

{
  string *psVar1;
  uint uVar2;
  ulong uVar3;
  SizedPtr SVar4;
  unsigned_long local_38 [2];
  size_t local_28;
  
  uVar3 = (ulong)prev_capacity << 6;
  if (0xfbf < uVar3) {
    uVar3 = 0xfc0;
  }
  SVar4 = AllocateAtLeast(uVar3 + 0x40);
  local_28 = SVar4.n;
  uVar2 = (int)SVar4.n - 0x10;
  local_38[0] = (ulong)(uVar2 & 0xfffffff0) + 0x10;
  psVar1 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                     (local_38,&local_28,"SerialArenaChunk::AllocSize(next_capacity) <= mem.n");
  if (psVar1 == (string *)0x0) {
    SerialArenaChunk::SerialArenaChunk((SerialArenaChunk *)SVar4.p,uVar2 >> 4,id,serial);
    return (SerialArenaChunk *)SVar4.p;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/arena.cc"
             ,0x2a6,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_38);
}

Assistant:

ThreadSafeArena::SerialArenaChunk* ThreadSafeArena::NewSerialArenaChunk(
    uint32_t prev_capacity, void* id, SerialArena* serial) {
  constexpr size_t kMaxBytes = 4096;  // Can hold up to 255 entries.
  constexpr size_t kGrowthFactor = 4;
  constexpr size_t kHeaderSize = SerialArenaChunk::AllocSize(0);
  constexpr size_t kEntrySize = SerialArenaChunk::AllocSize(1) - kHeaderSize;

  // On x64 arch: {4, 16, 64, 256, 256, ...} * 16.
  size_t prev_bytes = SerialArenaChunk::AllocSize(prev_capacity);
  size_t next_bytes = std::min(kMaxBytes, prev_bytes * kGrowthFactor);
  uint32_t next_capacity =
      static_cast<uint32_t>(next_bytes - kHeaderSize) / kEntrySize;
  // Growth based on bytes needs to be adjusted by AllocSize.
  next_bytes = SerialArenaChunk::AllocSize(next_capacity);

  // If we allocate bigger memory than requested, we should expand
  // size to use that extra space, and add extra entries permitted
  // by the extra space.
  SizedPtr mem = AllocateAtLeast(next_bytes);
  next_capacity = static_cast<uint32_t>(mem.n - kHeaderSize) / kEntrySize;
  ABSL_DCHECK_LE(SerialArenaChunk::AllocSize(next_capacity), mem.n);
  return new (mem.p) SerialArenaChunk{next_capacity, id, serial};
}